

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.cpp
# Opt level: O0

errno_t rand_s(uint *randomValue)

{
  uint *randomValue_local;
  
  if (randomValue != (uint *)0x0) {
    GetRandom(randomValue);
  }
  randomValue_local._4_4_ = (uint)(randomValue == (uint *)0x0);
  return randomValue_local._4_4_;
}

Assistant:

errno_t __cdecl rand_s(unsigned int* randomValue) noexcept
{
    if (randomValue == nullptr) return 1;

    GetRandom(randomValue);
    return 0;
}